

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O0

Equality __thiscall capnp::AnyStruct::Reader::equals(Reader *this,Reader right)

{
  int *__return_storage_ptr__;
  Reader right_00;
  uint uVar1;
  Equality EVar2;
  uchar *puVar3;
  bool bVar4;
  bool local_19c;
  bool local_19b;
  undefined1 auStack_168 [8];
  Reader r;
  Reader l;
  uint uStack_120;
  Equality eqResult;
  size_t i;
  ulong local_f8;
  size_t ptrsSizeR;
  Reader ptrsR;
  ulong local_a0;
  size_t ptrsSizeL;
  Reader ptrsL;
  ArrayPtr<const_unsigned_char> local_58;
  size_t local_48;
  size_t dataSizeR;
  ArrayPtr<const_unsigned_char> dataR;
  size_t dataSizeL;
  ArrayPtr<const_unsigned_char> dataL;
  Reader *this_local;
  
  dataL.size_ = (size_t)this;
  _dataSizeL = getDataSection(this);
  dataR.size_ = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&dataSizeL)
  ;
  while( true ) {
    bVar4 = false;
    if (dataR.size_ != 0) {
      puVar3 = kj::ArrayPtr<const_unsigned_char>::operator[]
                         ((ArrayPtr<const_unsigned_char> *)&dataSizeL,dataR.size_ - 1);
      bVar4 = *puVar3 == '\0';
    }
    if (!bVar4) break;
    dataR.size_ = dataR.size_ - 1;
  }
  _dataSizeR = getDataSection(&right);
  local_48 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&dataSizeR);
  while( true ) {
    bVar4 = false;
    if (local_48 != 0) {
      puVar3 = kj::ArrayPtr<const_unsigned_char>::operator[]
                         ((ArrayPtr<const_unsigned_char> *)&dataSizeR,local_48 - 1);
      bVar4 = *puVar3 == '\0';
    }
    if (!bVar4) break;
    local_48 = local_48 - 1;
  }
  local_58 = kj::ArrayPtr<const_unsigned_char>::first
                       ((ArrayPtr<const_unsigned_char> *)&dataSizeL,dataR.size_);
  join_0x00000010_0x00000000_ =
       kj::ArrayPtr<const_unsigned_char>::first
                 ((ArrayPtr<const_unsigned_char> *)&dataSizeR,local_48);
  bVar4 = kj::ArrayPtr<const_unsigned_char>::operator==
                    (&local_58,(ArrayPtr<const_unsigned_char> *)&ptrsL.reader.nestingLimit);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    getPointerSection((Reader *)&ptrsSizeL,this);
    uVar1 = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size((Reader *)&ptrsSizeL);
    local_a0 = (ulong)uVar1;
    while( true ) {
      local_19b = false;
      if (local_a0 != 0) {
        List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                  ((Reader *)&ptrsR.reader.nestingLimit,(Reader *)&ptrsSizeL,(int)local_a0 - 1);
        local_19b = AnyPointer::Reader::isNull((Reader *)&ptrsR.reader.nestingLimit);
      }
      if (local_19b == false) break;
      local_a0 = local_a0 - 1;
    }
    getPointerSection((Reader *)&ptrsSizeR,&right);
    uVar1 = List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::size((Reader *)&ptrsSizeR);
    local_f8 = (ulong)uVar1;
    while( true ) {
      local_19c = false;
      if (local_f8 != 0) {
        List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                  ((Reader *)&i,(Reader *)&ptrsSizeR,(int)local_f8 - 1);
        local_19c = AnyPointer::Reader::isNull((Reader *)&i);
      }
      if (local_19c == false) break;
      local_f8 = local_f8 - 1;
    }
    if (local_a0 == local_f8) {
      l.reader._28_4_ = 1;
      for (_uStack_120 = 0; _uStack_120 < local_a0; _uStack_120 = _uStack_120 + 1) {
        __return_storage_ptr__ = &r.reader.nestingLimit;
        List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                  ((Reader *)__return_storage_ptr__,(Reader *)&ptrsSizeL,uStack_120);
        List<capnp::AnyPointer,_(capnp::Kind)7>::Reader::operator[]
                  ((Reader *)auStack_168,(Reader *)&ptrsSizeR,uStack_120);
        right_00.reader.capTable = (CapTableReader *)r.reader.segment;
        right_00.reader.segment = (SegmentReader *)auStack_168;
        right_00.reader.pointer = (WirePointer *)r.reader.capTable;
        right_00.reader._24_8_ = r.reader.pointer;
        EVar2 = AnyPointer::Reader::equals((Reader *)__return_storage_ptr__,right_00);
        if (EVar2 == NOT_EQUAL) {
          return NOT_EQUAL;
        }
        if (EVar2 != EQUAL) {
          if (EVar2 != UNKNOWN_CONTAINS_CAPS) {
            kj::_::unreachable();
          }
          l.reader._28_4_ = 2;
        }
      }
      this_local._4_4_ = l.reader._28_4_;
    }
    else {
      this_local._4_4_ = NOT_EQUAL;
    }
  }
  else {
    this_local._4_4_ = NOT_EQUAL;
  }
  return this_local._4_4_;
}

Assistant:

Equality AnyStruct::Reader::equals(AnyStruct::Reader right) const {
  auto dataL = getDataSection();
  size_t dataSizeL = dataL.size();
  while(dataSizeL > 0 && dataL[dataSizeL - 1] == 0) {
    -- dataSizeL;
  }

  auto dataR = right.getDataSection();
  size_t dataSizeR = dataR.size();
  while(dataSizeR > 0 && dataR[dataSizeR - 1] == 0) {
    -- dataSizeR;
  }

  if(dataL.first(dataSizeL) != dataR.first(dataSizeR)) {
    return Equality::NOT_EQUAL;
  }

  auto ptrsL = getPointerSection();
  size_t ptrsSizeL = ptrsL.size();
  while (ptrsSizeL > 0 && ptrsL[ptrsSizeL - 1].isNull()) {
    -- ptrsSizeL;
  }

  auto ptrsR = right.getPointerSection();
  size_t ptrsSizeR = ptrsR.size();
  while (ptrsSizeR > 0 && ptrsR[ptrsSizeR - 1].isNull()) {
    -- ptrsSizeR;
  }

  if(ptrsSizeL != ptrsSizeR) {
    return Equality::NOT_EQUAL;
  }

  size_t i = 0;

  auto eqResult = Equality::EQUAL;
  for (; i < ptrsSizeL; i++) {
    auto l = ptrsL[i];
    auto r = ptrsR[i];
    switch(l.equals(r)) {
      case Equality::EQUAL:
        break;
      case Equality::NOT_EQUAL:
        return Equality::NOT_EQUAL;
      case Equality::UNKNOWN_CONTAINS_CAPS:
        eqResult = Equality::UNKNOWN_CONTAINS_CAPS;
        break;
      default:
        KJ_UNREACHABLE;
    }
  }

  return eqResult;
}